

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O0

void __thiscall BmsNoteManager::Mirror(BmsNoteManager *this,int s,int e)

{
  int target;
  int lane;
  int i;
  int keycount;
  int e_local;
  int s_local;
  BmsNoteManager *this_local;
  
  for (target = 0; target < ((e - s) + 1) / 2; target = target + 1) {
    swap(this->lanes_ + (s + target),this->lanes_ + (e - target));
  }
  return;
}

Assistant:

void BmsNoteManager::Mirror(int s, int e) {
	// soooooooo easy one
	// (excludes scratch)
	int keycount = e - s + 1;
	for (int i = 0; i < keycount / 2; i++) {
		int lane = s + i;
		int target = e - i;
		swap(lanes_[lane], lanes_[target]);
	}
}